

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vtabCallConstructor(sqlite3 *db,Table *pTab,Module *pMod,
                       _func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr
                       *xConstruct,char **pzErr)

{
  int iVar1;
  char *pcVar2;
  code *in_RCX;
  Module *in_RDX;
  Table *in_RSI;
  sqlite3 *in_RDI;
  undefined8 *in_R8;
  int nDel;
  int j;
  int i;
  int nType;
  char *zType;
  int iCol;
  char *zFormat;
  int iDb;
  char *zModuleName;
  char *zErr;
  int nArg;
  char **azArg;
  int rc;
  VTable *pVTable;
  VtabCtx *pPriorCtx;
  VtabCtx sCtx;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int local_8c;
  long local_70;
  int local_64;
  char **local_60;
  int local_54;
  VTable *local_50;
  VtabCtx *local_48;
  VtabCtx local_40;
  undefined8 *local_30;
  code *local_28;
  Module *local_20;
  Table *local_18;
  sqlite3 *local_10;
  int local_4;
  
  local_60 = in_RSI->azModuleArg;
  local_64 = in_RSI->nModuleArg;
  local_70 = 0;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  pcVar2 = sqlite3MPrintf(in_RDI,"%s",in_RSI->zName);
  if (pcVar2 == (char *)0x0) {
    local_4 = 7;
  }
  else {
    local_50 = (VTable *)
               sqlite3DbMallocZero((sqlite3 *)
                                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (local_50 == (VTable *)0x0) {
      sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      local_4 = 7;
    }
    else {
      local_50->db = local_10;
      local_50->pMod = local_20;
      iVar1 = sqlite3SchemaToIndex(local_10,local_18->pSchema);
      local_18->azModuleArg[1] = local_10->aDb[iVar1].zName;
      local_40.pTab = local_18;
      local_40.pVTable = local_50;
      local_48 = local_10->pVtabCtx;
      local_10->pVtabCtx = &local_40;
      local_54 = (*local_28)(local_10,local_20->pAux,local_64,local_60,&local_50->pVtab,&local_70);
      local_10->pVtabCtx = local_48;
      if (local_54 == 7) {
        local_10->mallocFailed = '\x01';
      }
      if (local_54 == 0) {
        if (local_50->pVtab != (sqlite3_vtab *)0x0) {
          memset(local_50->pVtab,0,0x18);
          local_50->pVtab->pModule = local_20->pModule;
          local_50->nRef = 1;
          if (local_40.pTab == (Table *)0x0) {
            local_50->pNext = local_18->pVTable;
            local_18->pVTable = local_50;
            for (local_8c = 0; local_8c < local_18->nCol; local_8c = local_8c + 1) {
              pcVar2 = local_18->aCol[local_8c].zType;
              in_stack_ffffffffffffff60 = 0;
              if (pcVar2 != (char *)0x0) {
                in_stack_ffffffffffffff64 = sqlite3Strlen30(pcVar2);
                iVar1 = sqlite3_strnicmp("hidden",pcVar2,6);
                if ((iVar1 != 0) || ((pcVar2[6] != '\0' && (pcVar2[6] != ' ')))) {
                  for (in_stack_ffffffffffffff60 = 0;
                      in_stack_ffffffffffffff60 < in_stack_ffffffffffffff64;
                      in_stack_ffffffffffffff60 = in_stack_ffffffffffffff60 + 1) {
                    iVar1 = sqlite3_strnicmp(" hidden",pcVar2 + in_stack_ffffffffffffff60,7);
                    if ((iVar1 == 0) &&
                       ((pcVar2[in_stack_ffffffffffffff60 + 7] == '\0' ||
                        (pcVar2[in_stack_ffffffffffffff60 + 7] == ' ')))) {
                      in_stack_ffffffffffffff60 = in_stack_ffffffffffffff60 + 1;
                      break;
                    }
                  }
                }
                if (in_stack_ffffffffffffff60 < in_stack_ffffffffffffff64) {
                  in_stack_ffffffffffffff58 = (pcVar2[in_stack_ffffffffffffff60 + 6] != '\0') + 6;
                  for (in_stack_ffffffffffffff5c = in_stack_ffffffffffffff60;
                      in_stack_ffffffffffffff5c + in_stack_ffffffffffffff58 <=
                      in_stack_ffffffffffffff64;
                      in_stack_ffffffffffffff5c = in_stack_ffffffffffffff5c + 1) {
                    pcVar2[in_stack_ffffffffffffff5c] =
                         pcVar2[in_stack_ffffffffffffff5c + in_stack_ffffffffffffff58];
                  }
                  if ((pcVar2[in_stack_ffffffffffffff60] == '\0') && (0 < in_stack_ffffffffffffff60)
                     ) {
                    pcVar2[in_stack_ffffffffffffff60 + -1] = '\0';
                  }
                  local_18->aCol[local_8c].colFlags = local_18->aCol[local_8c].colFlags | 2;
                }
              }
            }
          }
          else {
            pcVar2 = sqlite3MPrintf(local_10,"vtable constructor did not declare schema: %s",
                                    local_18->zName);
            *local_30 = pcVar2;
            sqlite3VtabUnlock((VTable *)
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
            local_54 = 1;
          }
        }
      }
      else {
        if (local_70 == 0) {
          pcVar2 = sqlite3MPrintf(local_10,"vtable constructor failed: %s",pcVar2);
          *local_30 = pcVar2;
        }
        else {
          pcVar2 = sqlite3MPrintf(local_10,"%s",local_70);
          *local_30 = pcVar2;
          sqlite3_free((void *)0x15cf64);
        }
        sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
      sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      local_4 = local_54;
    }
  }
  return local_4;
}

Assistant:

static int vtabCallConstructor(
  sqlite3 *db, 
  Table *pTab,
  Module *pMod,
  int (*xConstruct)(sqlite3*,void*,int,const char*const*,sqlite3_vtab**,char**),
  char **pzErr
){
  VtabCtx sCtx, *pPriorCtx;
  VTable *pVTable;
  int rc;
  const char *const*azArg = (const char *const*)pTab->azModuleArg;
  int nArg = pTab->nModuleArg;
  char *zErr = 0;
  char *zModuleName = sqlite3MPrintf(db, "%s", pTab->zName);
  int iDb;

  if( !zModuleName ){
    return SQLITE_NOMEM;
  }

  pVTable = sqlite3DbMallocZero(db, sizeof(VTable));
  if( !pVTable ){
    sqlite3DbFree(db, zModuleName);
    return SQLITE_NOMEM;
  }
  pVTable->db = db;
  pVTable->pMod = pMod;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  pTab->azModuleArg[1] = db->aDb[iDb].zName;

  /* Invoke the virtual table constructor */
  assert( &db->pVtabCtx );
  assert( xConstruct );
  sCtx.pTab = pTab;
  sCtx.pVTable = pVTable;
  pPriorCtx = db->pVtabCtx;
  db->pVtabCtx = &sCtx;
  rc = xConstruct(db, pMod->pAux, nArg, azArg, &pVTable->pVtab, &zErr);
  db->pVtabCtx = pPriorCtx;
  if( rc==SQLITE_NOMEM ) db->mallocFailed = 1;

  if( SQLITE_OK!=rc ){
    if( zErr==0 ){
      *pzErr = sqlite3MPrintf(db, "vtable constructor failed: %s", zModuleName);
    }else {
      *pzErr = sqlite3MPrintf(db, "%s", zErr);
      sqlite3_free(zErr);
    }
    sqlite3DbFree(db, pVTable);
  }else if( ALWAYS(pVTable->pVtab) ){
    /* Justification of ALWAYS():  A correct vtab constructor must allocate
    ** the sqlite3_vtab object if successful.  */
    memset(pVTable->pVtab, 0, sizeof(pVTable->pVtab[0]));
    pVTable->pVtab->pModule = pMod->pModule;
    pVTable->nRef = 1;
    if( sCtx.pTab ){
      const char *zFormat = "vtable constructor did not declare schema: %s";
      *pzErr = sqlite3MPrintf(db, zFormat, pTab->zName);
      sqlite3VtabUnlock(pVTable);
      rc = SQLITE_ERROR;
    }else{
      int iCol;
      /* If everything went according to plan, link the new VTable structure
      ** into the linked list headed by pTab->pVTable. Then loop through the 
      ** columns of the table to see if any of them contain the token "hidden".
      ** If so, set the Column COLFLAG_HIDDEN flag and remove the token from
      ** the type string.  */
      pVTable->pNext = pTab->pVTable;
      pTab->pVTable = pVTable;

      for(iCol=0; iCol<pTab->nCol; iCol++){
        char *zType = pTab->aCol[iCol].zType;
        int nType;
        int i = 0;
        if( !zType ) continue;
        nType = sqlite3Strlen30(zType);
        if( sqlite3StrNICmp("hidden", zType, 6)||(zType[6] && zType[6]!=' ') ){
          for(i=0; i<nType; i++){
            if( (0==sqlite3StrNICmp(" hidden", &zType[i], 7))
             && (zType[i+7]=='\0' || zType[i+7]==' ')
            ){
              i++;
              break;
            }
          }
        }
        if( i<nType ){
          int j;
          int nDel = 6 + (zType[i+6] ? 1 : 0);
          for(j=i; (j+nDel)<=nType; j++){
            zType[j] = zType[j+nDel];
          }
          if( zType[i]=='\0' && i>0 ){
            assert(zType[i-1]==' ');
            zType[i-1] = '\0';
          }
          pTab->aCol[iCol].colFlags |= COLFLAG_HIDDEN;
        }
      }
    }
  }

  sqlite3DbFree(db, zModuleName);
  return rc;
}